

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RVOSimulator.cpp
# Opt level: O3

void __thiscall
RVO::RVOSimulator::setAgentDefaults
          (RVOSimulator *this,float neighborDist,size_t maxNeighbors,float timeHorizon,
          float timeHorizonObst,float radius,float maxSpeed,Vector2 *velocity)

{
  Agent *this_00;
  
  this_00 = this->defaultAgent_;
  if (this_00 == (Agent *)0x0) {
    this_00 = (Agent *)operator_new(0x98);
    Agent::Agent(this_00,this);
    this->defaultAgent_ = this_00;
  }
  this_00->maxNeighbors_ = maxNeighbors;
  this_00->maxSpeed_ = maxSpeed;
  this_00->neighborDist_ = neighborDist;
  this_00->radius_ = radius;
  this_00->timeHorizon_ = timeHorizon;
  this_00->timeHorizonObst_ = timeHorizonObst;
  this_00->velocity_ = *velocity;
  return;
}

Assistant:

void RVOSimulator::setAgentDefaults(float neighborDist, size_t maxNeighbors, float timeHorizon, float timeHorizonObst, float radius, float maxSpeed, const Vector2 &velocity)
	{
		if (defaultAgent_ == NULL) {
			defaultAgent_ = new Agent(this);
		}

		defaultAgent_->maxNeighbors_ = maxNeighbors;
		defaultAgent_->maxSpeed_ = maxSpeed;
		defaultAgent_->neighborDist_ = neighborDist;
		defaultAgent_->radius_ = radius;
		defaultAgent_->timeHorizon_ = timeHorizon;
		defaultAgent_->timeHorizonObst_ = timeHorizonObst;
		defaultAgent_->velocity_ = velocity;
	}